

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_int<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,uint value,
          basic_format_specs<wchar_t> *spec)

{
  byte bVar1;
  byte bVar2;
  int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_> local_20;
  
  bVar1 = spec->type;
  local_20.prefix_size = 0;
  bVar2 = (byte)spec->field_0x9 >> 4 & 7;
  if (1 < bVar2) {
    local_20.prefix[0] = ' ';
    if (bVar2 == 2) {
      local_20.prefix[0] = '+';
    }
    local_20.prefix_size = 1;
  }
  local_20.writer = (basic_writer<fmt::v6::buffer_range<wchar_t>_> *)this;
  local_20.specs = spec;
  local_20.abs_value = value;
  if (bVar1 < 0x62) {
    if (bVar1 < 0x4c) {
      if (bVar1 == 0) {
LAB_001544b6:
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::on_dec(&local_20);
        return;
      }
      if (bVar1 == 0x42) goto LAB_001544ce;
    }
    else {
      if (bVar1 == 0x4c) goto LAB_001544c2;
      if (bVar1 == 0x58) goto LAB_001544a0;
    }
  }
  else if (bVar1 < 0x6e) {
    if (bVar1 == 0x62) {
LAB_001544ce:
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin(&local_20);
      return;
    }
    if (bVar1 == 100) goto LAB_001544b6;
  }
  else {
    if (bVar1 == 0x6e) {
LAB_001544c2:
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::on_num(&local_20);
      return;
    }
    if (bVar1 == 0x6f) {
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct(&local_20);
      return;
    }
    if (bVar1 == 0x78) {
LAB_001544a0:
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::on_hex(&local_20);
      return;
    }
  }
  basic_writer<fmt::v6::buffer_range<wchar_t>_>::
  int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::on_error(&local_20);
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }